

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

void __thiscall duckdb_parquet::EncryptionWithFooterKey::read(EncryptionWithFooterKey *this)

{
  TProtocol *in_RSI;
  int iStack_58;
  
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(in_RSI);
  (*in_RSI->_vptr_TProtocol[0x19])();
  while( true ) {
    (*in_RSI->_vptr_TProtocol[0x1b])();
    if (iStack_58 == 0) break;
    (*in_RSI->_vptr_TProtocol[0x2c])();
    (*in_RSI->_vptr_TProtocol[0x1c])();
  }
  (*in_RSI->_vptr_TProtocol[0x1a])();
  in_RSI->input_recursion_depth_ = in_RSI->input_recursion_depth_ - 1;
  return;
}

Assistant:

uint32_t EncryptionWithFooterKey::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    xfer += iprot->skip(ftype);
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}